

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::SingularString::GenerateInlineAccessorDefinitions
          (SingularString *this,Printer *p)

{
  Descriptor *descriptor;
  char *in_R9;
  long lVar1;
  string_view prefix;
  anon_class_1_0_00000001 local_649;
  undefined1 *local_648;
  undefined8 local_640;
  undefined1 local_638;
  undefined7 uStack_637;
  undefined8 uStack_630;
  undefined1 *local_628;
  undefined8 local_620;
  undefined1 local_618;
  undefined7 uStack_617;
  undefined8 uStack_610;
  undefined1 *local_608;
  undefined8 local_600;
  undefined1 local_5f8;
  undefined7 uStack_5f7;
  undefined8 uStack_5f0;
  undefined1 *local_5e8;
  long local_5e0;
  undefined1 local_5d8;
  undefined7 uStack_5d7;
  undefined1 auStack_5d0 [8];
  undefined1 *local_5c8;
  undefined8 local_5c0;
  undefined1 local_5b8;
  undefined7 uStack_5b7;
  undefined8 uStack_5b0;
  long *local_5a8 [2];
  long local_598 [2];
  Printer *local_588;
  undefined1 local_580 [32];
  Printer *local_560;
  string local_558;
  undefined1 *local_538;
  undefined8 local_530;
  undefined1 local_528 [8];
  undefined8 uStack_520;
  undefined8 *local_518;
  undefined8 local_510;
  code *local_508;
  code *local_500;
  undefined1 local_4f8;
  undefined1 *local_4f0;
  undefined8 local_4e8;
  undefined1 local_4e0 [16];
  undefined1 local_4d0;
  undefined1 local_488;
  undefined1 *local_480;
  long local_478;
  undefined1 local_470 [8];
  undefined8 uStack_468;
  long *local_460;
  undefined8 local_458;
  code *local_450;
  code *local_448;
  undefined1 local_440;
  undefined1 *local_438;
  undefined8 local_430;
  undefined1 local_428 [16];
  undefined1 local_418;
  undefined1 local_3d0;
  undefined1 *local_3c8;
  undefined8 local_3c0;
  undefined1 local_3b8 [8];
  undefined8 uStack_3b0;
  long *local_3a8;
  undefined8 local_3a0;
  code *local_398;
  code *local_390;
  undefined1 local_388;
  undefined1 *local_380;
  undefined8 local_378;
  undefined1 local_370 [16];
  undefined1 local_360;
  undefined1 local_318;
  undefined1 *local_310;
  undefined8 local_308;
  undefined1 local_300 [8];
  undefined8 uStack_2f8;
  undefined8 *local_2f0;
  undefined8 local_2e8;
  code *local_2e0;
  code *local_2d8;
  undefined1 local_2d0;
  undefined1 *local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8;
  undefined1 local_260;
  Sub local_258;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  undefined8 uStack_188;
  undefined8 *local_180;
  undefined8 local_178;
  code *local_170;
  code *local_168;
  undefined1 local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  long *local_e8;
  undefined8 local_e0;
  long local_d8;
  undefined8 uStack_d0;
  undefined8 *local_c8;
  undefined8 local_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  local_5c8 = &local_5b8;
  local_588 = p;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"if_IsDefault","");
  local_538 = local_528;
  if (local_5c8 == &local_5b8) {
    uStack_520 = uStack_5b0;
  }
  else {
    local_538 = local_5c8;
  }
  local_530 = local_5c0;
  local_5c0 = 0;
  local_5b8 = 0;
  local_5c8 = &local_5b8;
  local_518 = (undefined8 *)operator_new(0x18);
  *local_518 = this;
  local_518[1] = &local_588;
  *(undefined1 *)(local_518 + 2) = 0;
  local_500 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_510 = 0;
  local_508 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_4f8 = 1;
  local_4f0 = local_4e0;
  local_4e8 = 0;
  local_4e0[0] = 0;
  local_4d0 = 0;
  local_560 = p;
  std::__cxx11::string::_M_replace((ulong)&local_4f0,0,(char *)0x0,0x361ff2);
  local_488 = 0;
  local_5e8 = &local_5d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"update_hasbit","");
  local_480 = local_470;
  if (local_5e8 == &local_5d8) {
    uStack_468 = auStack_5d0;
  }
  else {
    local_480 = local_5e8;
  }
  local_478 = local_5e0;
  local_5e0 = 0;
  local_5d8 = 0;
  local_5e8 = &local_5d8;
  local_460 = (long *)operator_new(0x18);
  *local_460 = (long)&local_588;
  local_460[1] = (long)this;
  *(undefined1 *)(local_460 + 2) = 0;
  local_448 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_458 = 0;
  local_450 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_440 = 1;
  local_438 = local_428;
  local_430 = 0;
  local_428[0] = 0;
  local_418 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_438,0,(char *)0x0,0x361ff2);
  local_3d0 = 0;
  local_608 = &local_5f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"set_args","");
  local_3c8 = local_3b8;
  if (local_608 == &local_5f8) {
    uStack_3b0 = uStack_5f0;
  }
  else {
    local_3c8 = local_608;
  }
  local_3c0 = local_600;
  local_600 = 0;
  local_5f8 = 0;
  local_608 = &local_5f8;
  local_3a8 = (long *)operator_new(0x18);
  *local_3a8 = (long)&local_588;
  local_3a8[1] = (long)this;
  *(undefined1 *)(local_3a8 + 2) = 0;
  local_390 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_3a0 = 0;
  local_398 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_388 = 1;
  local_380 = local_370;
  local_378 = 0;
  local_370[0] = 0;
  local_360 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_380,0,(char *)0x0,0x361ff2);
  local_318 = 0;
  local_628 = &local_618;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"check_hasbit","");
  local_310 = local_300;
  if (local_628 == &local_618) {
    uStack_2f8 = uStack_610;
  }
  else {
    local_310 = local_628;
  }
  local_308 = local_620;
  local_620 = 0;
  local_618 = 0;
  local_628 = &local_618;
  local_2f0 = (undefined8 *)operator_new(0x18);
  *local_2f0 = this;
  local_2f0[1] = &local_588;
  *(undefined1 *)(local_2f0 + 2) = 0;
  local_2d8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_2e8 = 0;
  local_2e0 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_2d0 = 1;
  local_2c8 = local_2b8;
  local_2c0 = 0;
  local_2b8[0] = 0;
  local_2a8 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_2c8,0,(char *)0x0,0x361ff2);
  local_260 = 0;
  local_580._0_8_ = local_580 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"release_name","");
  descriptor = (Descriptor *)(this->super_FieldGeneratorBase).field_;
  prefix._M_str = in_R9;
  prefix._M_len = (size_t)"release_";
  SafeFunctionName_abi_cxx11_
            (&local_558,*(cpp **)(descriptor + 0x20),descriptor,(FieldDescriptor *)&DAT_00000008,
             prefix);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_258,(string *)local_580,&local_558);
  local_648 = &local_638;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"release_impl","");
  local_1a0 = local_190;
  if (local_648 == &local_638) {
    uStack_188 = uStack_630;
  }
  else {
    local_1a0 = local_648;
  }
  local_198 = local_640;
  local_640 = 0;
  local_638 = 0;
  local_648 = &local_638;
  local_180 = (undefined8 *)operator_new(0x18);
  *local_180 = this;
  local_180[1] = &local_588;
  *(undefined1 *)(local_180 + 2) = 0;
  local_168 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_178 = 0;
  local_170 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_160 = 1;
  local_158 = local_148;
  local_150 = 0;
  local_148[0] = 0;
  local_138 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)0x0,0x361ff2);
  local_f0 = 0;
  local_5a8[0] = local_598;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5a8,"set_allocated_impl","");
  local_e8 = &local_d8;
  if (local_5a8[0] == local_598) {
    uStack_d0 = local_598[1];
  }
  else {
    local_e8 = local_5a8[0];
  }
  local_e0 = local_5a8[1];
  local_5a8[1] = (long *)0x0;
  local_598[0]._0_1_ = 0;
  local_5a8[0] = local_598;
  local_c8 = (undefined8 *)operator_new(0x18);
  *local_c8 = this;
  local_c8[1] = &local_588;
  *(undefined1 *)(local_c8 + 2) = 0;
  local_b0 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
             ::_M_invoke;
  local_c0 = 0;
  local_b8 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
             ::_M_manager;
  local_a8 = 1;
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_80 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x361ff2);
  local_38 = 0;
  google::protobuf::io::Printer::Emit
            (local_560,&local_538,7,0xa09,
             "\n        inline const std::string& $Msg$::$name$() const\n            ABSL_ATTRIBUTE_LIFETIME_BOUND {\n          $WeakDescriptorSelfPin$;\n          $annotate_get$;\n          // @@protoc_insertion_point(field_get:$pkg.Msg.field$)\n          $if_IsDefault$;\n          return _internal_$name_internal$();\n        }\n        template <typename Arg_, typename... Args_>\n        inline PROTOBUF_ALWAYS_INLINE void $Msg$::set_$name$(Arg_&& arg,\n                                                             Args_... args) {\n          $WeakDescriptorSelfPin$;\n          $TsanDetectConcurrentMutation$;\n          $PrepareSplitMessageForWrite$;\n          $update_hasbit$;\n          $field_$.$Set$(static_cast<Arg_&&>(arg), args..., $set_args$);\n          $annotate_set$;\n          // @@protoc_insertion_point(field_set:$pkg.Msg.field$)\n        }\n        inline std::string* $Msg$::mutable_$name$() ABSL_ATTRIBUTE_LIFETIME_BOUND {\n          $WeakDescriptorSelfPin$;\n          $PrepareSplitMessageForWrite$;\n          std::string* _s = _internal_mutable_$name_internal$();\n          $annotate_mutable$;\n          // @@protoc_insertion_point(field_mutable:$pkg.Msg.field$)\n          return _s;\n        }\n        inline const std::string& $Msg$::_internal_$name_internal$() const {\n          $TsanDetectConcurrentRead$;\n          $check_hasbit$;\n          return $field_$.Get();\n        }\n        inline void $Msg$::_internal_set_$name_internal$(const std::string& value) {\n          $TsanDetectConcurrentMutation$;\n          $update_hasbit$;\n          //~ Don\'t use $Set$ here; we always want the std::string variant\n          //~ regardless of whether this is a `bytes` field.\n          $field_$.Set(value, $set_args$);\n        }\n        inline std::string* $Msg$::_internal_mutable_$name_internal$() {\n          $TsanDetectConcurrentMutation$;\n          $update_hasbit$;\n          return $field_$.Mutable($lazy_args$, $set_args$);\n        }\n        inline std::string* $Msg$::$release_name$() {\n          $WeakDescriptorSelfPin$;\n          $TsanDetectConcurrentMut..." /* TRUNCATED STRING LITERAL */
            );
  lVar1 = 0x508;
  do {
    if (local_558.field_2._M_local_buf[lVar1 + 8] == '\x01') {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (local_580 + lVar1));
    }
    if ((long *)((long)local_598 + lVar1) != *(long **)((long)local_5a8 + lVar1)) {
      operator_delete(*(long **)((long)local_5a8 + lVar1),*(long *)((long)local_598 + lVar1) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[*(byte *)((long)&uStack_5b0 + lVar1)]._M_data)
              (&local_649,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(auStack_5d0 + lVar1));
    *(undefined1 *)((long)&uStack_5b0 + lVar1) = 0xff;
    if ((long *)((long)&local_5e0 + lVar1) != *(long **)((long)&uStack_5f0 + lVar1)) {
      operator_delete(*(long **)((long)&uStack_5f0 + lVar1),*(long *)((long)&local_5e0 + lVar1) + 1)
      ;
    }
    lVar1 = lVar1 + -0xb8;
  } while (lVar1 != 0);
  if (local_5a8[0] != local_598) {
    operator_delete(local_5a8[0],CONCAT71(local_598[0]._1_7_,(undefined1)local_598[0]) + 1);
  }
  if (local_648 != &local_638) {
    operator_delete(local_648,CONCAT71(uStack_637,local_638) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_580._0_8_ != local_580 + 0x10) {
    operator_delete((void *)local_580._0_8_,local_580._16_8_ + 1);
  }
  if (local_628 != &local_618) {
    operator_delete(local_628,CONCAT71(uStack_617,local_618) + 1);
  }
  if (local_608 != &local_5f8) {
    operator_delete(local_608,CONCAT71(uStack_5f7,local_5f8) + 1);
  }
  if (local_5e8 != &local_5d8) {
    operator_delete(local_5e8,CONCAT71(uStack_5d7,local_5d8) + 1);
  }
  if (local_5c8 != &local_5b8) {
    operator_delete(local_5c8,CONCAT71(uStack_5b7,local_5b8) + 1);
  }
  if ((this->super_FieldGeneratorBase).is_inlined_ == true) {
    google::protobuf::io::Printer::Emit
              (local_588,0,0,0x7b,
               "\n      inline bool $Msg$::_internal_$name_internal$_donated() const {\n        return $inlined_string_donated$;\n      }\n    "
              );
  }
  return;
}

Assistant:

void SingularString::GenerateInlineAccessorDefinitions(io::Printer* p) const {
  p->Emit(
      {
          {"if_IsDefault",
           [&] {
             if (EmptyDefault() || is_oneof()) return;
             p->Emit(R"cc(
               if ($field_$.IsDefault()) {
                 return $default_variable_field$.get();
               }
             )cc");
           }},
          {"update_hasbit", [&] { UpdateHasbitSet(p, is_oneof()); }},
          {"set_args", [&] { ArgsForSetter(p, is_inlined()); }},
          {"check_hasbit",
           [&] {
             if (!is_oneof()) return;
             p->Emit(R"cc(
               if ($not_has_field$) {
                 return $kDefaultStr$;
               }
             )cc");
           }},
          {"release_name",
           SafeFunctionName(field_->containing_type(), field_, "release_")},
          {"release_impl", [&] { ReleaseImpl(p); }},
          {"set_allocated_impl", [&] { SetAllocatedImpl(p); }},
      },
      R"cc(
        inline const std::string& $Msg$::$name$() const
            ABSL_ATTRIBUTE_LIFETIME_BOUND {
          $WeakDescriptorSelfPin$;
          $annotate_get$;
          // @@protoc_insertion_point(field_get:$pkg.Msg.field$)
          $if_IsDefault$;
          return _internal_$name_internal$();
        }
        template <typename Arg_, typename... Args_>
        inline PROTOBUF_ALWAYS_INLINE void $Msg$::set_$name$(Arg_&& arg,
                                                             Args_... args) {
          $WeakDescriptorSelfPin$;
          $TsanDetectConcurrentMutation$;
          $PrepareSplitMessageForWrite$;
          $update_hasbit$;
          $field_$.$Set$(static_cast<Arg_&&>(arg), args..., $set_args$);
          $annotate_set$;
          // @@protoc_insertion_point(field_set:$pkg.Msg.field$)
        }
        inline std::string* $Msg$::mutable_$name$() ABSL_ATTRIBUTE_LIFETIME_BOUND {
          $WeakDescriptorSelfPin$;
          $PrepareSplitMessageForWrite$;
          std::string* _s = _internal_mutable_$name_internal$();
          $annotate_mutable$;
          // @@protoc_insertion_point(field_mutable:$pkg.Msg.field$)
          return _s;
        }
        inline const std::string& $Msg$::_internal_$name_internal$() const {
          $TsanDetectConcurrentRead$;
          $check_hasbit$;
          return $field_$.Get();
        }
        inline void $Msg$::_internal_set_$name_internal$(const std::string& value) {
          $TsanDetectConcurrentMutation$;
          $update_hasbit$;
          //~ Don't use $Set$ here; we always want the std::string variant
          //~ regardless of whether this is a `bytes` field.
          $field_$.Set(value, $set_args$);
        }
        inline std::string* $Msg$::_internal_mutable_$name_internal$() {
          $TsanDetectConcurrentMutation$;
          $update_hasbit$;
          return $field_$.Mutable($lazy_args$, $set_args$);
        }
        inline std::string* $Msg$::$release_name$() {
          $WeakDescriptorSelfPin$;
          $TsanDetectConcurrentMutation$;
          $annotate_release$;
          $PrepareSplitMessageForWrite$;
          // @@protoc_insertion_point(field_release:$pkg.Msg.field$)
          $release_impl$;
        }
        inline void $Msg$::set_allocated_$name$(std::string* value) {
          $WeakDescriptorSelfPin$;
          $TsanDetectConcurrentMutation$;
          $PrepareSplitMessageForWrite$;
          $set_allocated_impl$;
          $annotate_set$;
          // @@protoc_insertion_point(field_set_allocated:$pkg.Msg.field$)
        }
      )cc");

  if (is_inlined()) {
    p->Emit(R"cc(
      inline bool $Msg$::_internal_$name_internal$_donated() const {
        return $inlined_string_donated$;
      }
    )cc");
  }
}